

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::ChompCharGroupInst<(UnifiedRegex::ChompMode)0>::Exec
          (ChompCharGroupInst<(UnifiedRegex::ChompMode)0> *this,Matcher *matcher,Char *input,
          CharCount inputLength,CharCount *matchStart,CharCount *inputOffset,
          CharCount *nextSyncInputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  Char CVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Type pRVar5;
  PageAllocation *pPVar6;
  GroupInfo *pGVar7;
  code *pcVar8;
  bool bVar9;
  undefined4 *puVar10;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  
  uVar2 = (this->super_GroupMixin).groupId;
  if (((long)(int)uVar2 < 0) || (((matcher->program).ptr)->numGroups <= uVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                       "groupId >= 0 && groupId < program->numGroups");
    if (!bVar9) goto LAB_00eefa79;
    *puVar10 = 0;
  }
  if ((matcher->groupInfos).ptr[(int)uVar2].length != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0xf30,"(matcher.GroupIdToGroupInfo(groupId)->IsUndefined())",
                       "matcher.GroupIdToGroupInfo(groupId)->IsUndefined()");
    if (!bVar9) goto LAB_00eefa79;
    *puVar10 = 0;
  }
  uVar2 = *inputOffset;
  uVar12 = (ulong)uVar2;
  CVar1 = (this->super_CharMixin).c;
  pRVar5 = matcher->stats;
  if (pRVar5 != (Type)0x0) {
    pRVar5->numCompares = pRVar5->numCompares + 1;
  }
  while( true ) {
    if (pRVar5 != (Type)0x0) {
      pRVar5->numCompares = pRVar5->numCompares + 1;
    }
    if ((inputLength <= uVar12) || (input[uVar12] != CVar1)) break;
    uVar12 = uVar12 + 1;
    *inputOffset = (CharCount)uVar12;
  }
  if ((this->super_NoNeedToSaveMixin).noNeedToSave == false) {
    sVar11 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.bufferSize;
    if (sVar11 - (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                 super_ContinuousPageStack<1UL>.nextTop < 0x18) {
      ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x18);
      sVar11 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
               super_ContinuousPageStack<1UL>.bufferSize;
    }
    if (sVar11 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar9) goto LAB_00eefa79;
      *puVar10 = 0;
    }
    pPVar6 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.pageAllocation;
    sVar11 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.nextTop;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = sVar11 + 0x18;
    *(size_t *)((long)&pPVar6[1].pageCount + sVar11) =
         (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
         topElementSize;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize
         = 0x18;
    iVar3 = (this->super_GroupMixin).groupId;
    *(undefined1 *)((long)&pPVar6[2].pageCount + sVar11) = 3;
    *(undefined ***)((long)&pPVar6[1].segment + sVar11) = &PTR_Print_01543308;
    *(int *)((long)&pPVar6[2].pageCount + sVar11 + 4) = iVar3;
    Matcher::PushStats(matcher,contStack,input);
  }
  uVar4 = (this->super_GroupMixin).groupId;
  lVar13 = (long)(int)uVar4;
  if ((lVar13 < 0) || (((matcher->program).ptr)->numGroups <= uVar4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                       "groupId >= 0 && groupId < program->numGroups");
    if (!bVar9) {
LAB_00eefa79:
      pcVar8 = (code *)invalidInstructionException();
      (*pcVar8)();
    }
    *puVar10 = 0;
  }
  pGVar7 = (matcher->groupInfos).ptr;
  pGVar7[lVar13].offset = uVar2;
  pGVar7[lVar13].length = *inputOffset - uVar2;
  *instPointer = *instPointer + 8;
  return false;
}

Assistant:

inline bool ChompCharGroupInst<Mode>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        Assert(matcher.GroupIdToGroupInfo(groupId)->IsUndefined());

        const CharCount inputStartOffset = inputOffset;
        const Char matchC = c;
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if(Mode == ChompMode::Star || (inputOffset < inputLength && input[inputOffset] == matchC))
        {
            while (true)
            {
                if (Mode != ChompMode::Star)
                {
                    ++inputOffset;
                }
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.CompStats();
#endif
                if (inputOffset < inputLength && input[inputOffset] == matchC)
                {
                    if (Mode == ChompMode::Star)
                    {
                        ++inputOffset;
                    }
                    continue;
                }
                break;
            }

            if (!noNeedToSave)
            {
                // UNDO ACTION: Restore group on backtrack
                PUSH(contStack, ResetGroupCont, groupId);
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.PushStats(contStack, input);
#endif
            }

            GroupInfo *const groupInfo = matcher.GroupIdToGroupInfo(groupId);
            groupInfo->offset = inputStartOffset;
            groupInfo->length = inputOffset - inputStartOffset;

            instPointer += sizeof(*this);
            return false;
        }

        return matcher.Fail(FAIL_PARAMETERS);
    }